

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O0

int experimental_hooks_install_ctl
              (tsd_t *tsd,size_t *mib,size_t miblen,void *oldp,size_t *oldlenp,void *newp,
              size_t newlen)

{
  undefined8 *in_RCX;
  ulong *in_R8;
  undefined8 *in_R9;
  size_t copylen;
  void *handle;
  hooks_t hooks;
  int ret;
  hooks_t *in_stack_ffffffffffffff88;
  ulong __n;
  tsdn_t *in_stack_ffffffffffffff90;
  void *local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  int local_3c;
  ulong *local_30;
  undefined8 *local_28;
  
  if (((in_RCX == (undefined8 *)0x0) || (in_R8 == (ulong *)0x0)) || (in_R9 == (undefined8 *)0x0)) {
    local_3c = 0x16;
  }
  else {
    if (in_R9 != (undefined8 *)0x0) {
      if (copylen != 0x20) {
        return 0x16;
      }
      local_60 = *in_R9;
      local_58 = in_R9[1];
      local_50 = in_R9[2];
      local_48 = in_R9[3];
    }
    local_30 = in_R8;
    local_28 = in_RCX;
    local_68 = hook_install(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    if (local_68 == (void *)0x0) {
      local_3c = 0xb;
    }
    else {
      if ((local_28 != (undefined8 *)0x0) && (local_30 != (ulong *)0x0)) {
        if (*local_30 != 8) {
          if (*local_30 < 8) {
            __n = *local_30;
          }
          else {
            __n = 8;
          }
          memcpy(local_28,&local_68,__n);
          return 0x16;
        }
        *local_28 = local_68;
      }
      local_3c = 0;
    }
  }
  return local_3c;
}

Assistant:

static int
experimental_hooks_install_ctl(tsd_t *tsd, const size_t *mib, size_t miblen,
    void *oldp, size_t *oldlenp, void *newp, size_t newlen) {
	int ret;
	if (oldp == NULL || oldlenp == NULL|| newp == NULL) {
		ret = EINVAL;
		goto label_return;
	}
	/*
	 * Note: this is a *private* struct.  This is an experimental interface;
	 * forcing the user to know the jemalloc internals well enough to
	 * extract the ABI hopefully ensures nobody gets too comfortable with
	 * this API, which can change at a moment's notice.
	 */
	hooks_t hooks;
	WRITE(hooks, hooks_t);
	void *handle = hook_install(tsd_tsdn(tsd), &hooks);
	if (handle == NULL) {
		ret = EAGAIN;
		goto label_return;
	}
	READ(handle, void *);

	ret = 0;
label_return:
	return ret;
}